

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this_00;
  Ch *pCVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar2;
  MemoryStream *pMVar3;
  MemoryStream *extraout_RAX;
  byte *pbVar4;
  byte *pbVar5;
  byte *extraout_RDX;
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *unaff_RBX;
  SizeType memberCount;
  byte bVar6;
  undefined4 uVar7;
  ulong uVar8;
  ulong unaff_R13;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *unaff_R14;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *s;
  bool bVar9;
  
  pMVar3 = is->is_;
  pbVar4 = (byte *)pMVar3->src_;
  if ((pbVar4 == (byte *)pMVar3->end_) || (*pbVar4 != 0x7b)) {
    ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              ();
    pMVar3 = extraout_RAX;
    pbVar5 = extraout_RDX;
LAB_0013948d:
    bVar9 = false;
LAB_0013923d:
    if ((pbVar5 != pbVar4) && (bVar9)) {
      pMVar3->src_ = (Ch *)(pbVar5 + 1);
    }
    this_00 = unaff_RBX + 0x30;
    if (bVar9) {
      bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndObject(handler,0);
      if (bVar9) {
        return;
      }
      ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this_00);
LAB_00139431:
      pMVar3 = unaff_R14->is_;
      pbVar4 = (byte *)pMVar3->src_;
      uVar7 = 0x10;
    }
    else {
      pMVar3 = unaff_R14->is_;
      pbVar4 = (byte *)pMVar3->src_;
      if ((pbVar4 != (byte *)pMVar3->end_) && (*pbVar4 == 0x22)) {
        memberCount = 0;
LAB_00139290:
        ParseString<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (unaff_RBX,unaff_R14,handler,true);
        if (*(int *)(unaff_RBX + 0x30) != 0) {
          return;
        }
        pMVar3 = unaff_R14->is_;
        pbVar4 = (byte *)pMVar3->src_;
        pbVar5 = (byte *)pMVar3->end_;
        do {
          if (pbVar4 == pbVar5) {
            uVar8 = 0;
          }
          else {
            uVar8 = (ulong)*pbVar4;
          }
          do {
            if ((0x20 < (byte)uVar8) || ((unaff_R13 >> (uVar8 & 0x3f) & 1) == 0)) {
              pbVar4 = (byte *)pMVar3->src_;
              if (pbVar4 == pbVar5) {
                bVar9 = false;
              }
              else {
                bVar9 = *pbVar4 == 0x3a;
                if (bVar9) {
                  pMVar3->src_ = (Ch *)(pbVar4 + 1);
                }
              }
              pbVar4 = (byte *)pMVar3->src_;
              if (bVar9) goto LAB_00139311;
              uVar7 = 5;
              goto LAB_0013946e;
            }
            uVar8 = 0;
          } while (pbVar4 == pbVar5);
          pbVar4 = pbVar4 + 1;
          pMVar3->src_ = (Ch *)pbVar4;
        } while( true );
      }
LAB_0013943e:
      uVar7 = 4;
      if (*(int *)this_00 != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x2f6,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
    }
LAB_0013946e:
    pCVar1 = pMVar3->begin_;
    *(undefined4 *)(unaff_RBX + 0x30) = uVar7;
    *(long *)(unaff_RBX + 0x38) = (long)pbVar4 - (long)pCVar1;
    return;
  }
  if (pbVar4 != (byte *)pMVar3->end_) {
    pMVar3->src_ = (Ch *)(pbVar4 + 1);
  }
  pGVar2 = internal::Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                     (&handler->stack_,1);
  (pGVar2->data_).n = (Number)0x0;
  (pGVar2->data_).s.str = (Ch *)0x0;
  (pGVar2->data_).f.flags = 3;
  pMVar3 = is->is_;
  pbVar5 = (byte *)pMVar3->src_;
  pbVar4 = (byte *)pMVar3->end_;
  unaff_R13 = 0x100002600;
  do {
    if (pbVar5 == pbVar4) {
      uVar8 = 0;
    }
    else {
      uVar8 = (ulong)*pbVar5;
    }
    do {
      if ((0x20 < (byte)uVar8) || ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0)) {
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pbVar5 = (byte *)pMVar3->src_;
        unaff_RBX = this;
        unaff_R14 = is;
        if (pbVar5 == pbVar4) goto LAB_0013948d;
        bVar9 = *pbVar5 == 0x7d;
        goto LAB_0013923d;
      }
      uVar8 = 0;
    } while (pbVar5 == pbVar4);
    pbVar5 = pbVar5 + 1;
    pMVar3->src_ = (Ch *)pbVar5;
  } while( true );
LAB_00139311:
  if (pbVar4 == pbVar5) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)*pbVar4;
  }
  do {
    if ((0x20 < (byte)uVar8) || ((unaff_R13 >> (uVar8 & 0x3f) & 1) == 0)) {
      if (*(int *)this_00 != 0) {
        return;
      }
      ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (unaff_RBX,unaff_R14,handler);
      if (*(int *)(unaff_RBX + 0x30) != 0) {
        return;
      }
      pMVar3 = unaff_R14->is_;
      pbVar4 = (byte *)pMVar3->src_;
      pbVar5 = (byte *)pMVar3->end_;
      goto LAB_00139369;
    }
    uVar8 = 0;
  } while (pbVar4 == pbVar5);
  pbVar4 = pbVar4 + 1;
  pMVar3->src_ = (Ch *)pbVar4;
  goto LAB_00139311;
LAB_00139369:
  if (pbVar4 == pbVar5) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)*pbVar4;
  }
  do {
    if ((0x20 < (byte)uVar8) || ((unaff_R13 >> (uVar8 & 0x3f) & 1) == 0)) {
      pbVar4 = (byte *)pMVar3->src_;
      if (pbVar4 == pbVar5) {
        bVar6 = 0;
      }
      else {
        bVar6 = *pbVar4;
      }
      memberCount = memberCount + 1;
      if (bVar6 == 0x2c) {
        if (pbVar4 != pbVar5) {
          pMVar3->src_ = (Ch *)(pbVar4 + 1);
        }
        pbVar4 = (byte *)pMVar3->src_;
        goto LAB_001393b5;
      }
      uVar7 = 6;
      if (bVar6 != 0x7d) goto LAB_0013946e;
      if (pbVar4 != pbVar5) {
        pMVar3->src_ = (Ch *)(pbVar4 + 1);
      }
      bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndObject(handler,memberCount);
      if (bVar9) {
        return;
      }
      ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this_00);
      goto LAB_00139431;
    }
    uVar8 = 0;
  } while (pbVar4 == pbVar5);
  pbVar4 = pbVar4 + 1;
  pMVar3->src_ = (Ch *)pbVar4;
  goto LAB_00139369;
LAB_001393b5:
  if (pbVar4 == pbVar5) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)*pbVar4;
  }
  do {
    if ((0x20 < (byte)uVar8) || ((unaff_R13 >> (uVar8 & 0x3f) & 1) == 0)) {
      pMVar3 = unaff_R14->is_;
      pbVar4 = (byte *)pMVar3->src_;
      if ((pbVar4 == (byte *)pMVar3->end_) || (*pbVar4 != 0x22)) goto LAB_0013943e;
      goto LAB_00139290;
    }
    uVar8 = 0;
  } while (pbVar4 == pbVar5);
  pbVar4 = pbVar4 + 1;
  pMVar3->src_ = (Ch *)pbVar4;
  goto LAB_001393b5;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }